

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rectangle.h
# Opt level: O0

rectangle * dlib::translate_rect(rectangle *rect,long x,long y)

{
  long lVar1;
  long in_RCX;
  long in_RDX;
  rectangle *in_RSI;
  rectangle *in_RDI;
  rectangle *result;
  
  rectangle::rectangle(in_RDI);
  lVar1 = rectangle::top(in_RSI);
  rectangle::set_top(in_RDI,lVar1 + in_RCX);
  lVar1 = rectangle::bottom(in_RSI);
  rectangle::set_bottom(in_RDI,lVar1 + in_RCX);
  lVar1 = rectangle::left(in_RSI);
  rectangle::set_left(in_RDI,lVar1 + in_RDX);
  lVar1 = rectangle::right(in_RSI);
  rectangle::set_right(in_RDI,lVar1 + in_RDX);
  return in_RDI;
}

Assistant:

inline const rectangle translate_rect (
        const rectangle& rect,
        long x,
        long y
    )
    {
        rectangle result;
        result.set_top ( rect.top() + y );
        result.set_bottom ( rect.bottom() + y );
        result.set_left ( rect.left() + x );
        result.set_right ( rect.right() + x );
        return result;
    }